

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O0

void * __thiscall CRingBufferBase::Prev(CRingBufferBase *this,void *pCurrent)

{
  long in_RSI;
  CRingBufferBase *in_RDI;
  CItem *pItem;
  CItem *local_20;
  
  local_20 = (CItem *)(in_RSI + -0x18);
  do {
    local_20 = PrevBlock(in_RDI,local_20);
    if (local_20 == in_RDI->m_pProduce) {
      return (void *)0x0;
    }
  } while (local_20->m_Free != 0);
  return local_20 + 1;
}

Assistant:

void *CRingBufferBase::Prev(void *pCurrent)
{
	CItem *pItem = ((CItem *)pCurrent) - 1;

	while(1)
	{
		pItem = PrevBlock(pItem);
		if(pItem == m_pProduce)
			return 0;
		if(!pItem->m_Free)
			return pItem+1;
	}
}